

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O3

void duckdb::SQLLogicTestLogger::PrintErrorHeader
               (string *file_name,idx_t query_line,string *description)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  
  PrintLineSep();
  puVar4 = (undefined8 *)&stderr;
  if (_stderr == (FILE *)0x0) {
LAB_0046e743:
    lVar2 = *(long *)(std::cerr + -0x18);
    if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar2)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar2);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)lVar2 + 0x5deff8,SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_0046e785;
  }
  else {
    iVar1 = fileno(_stderr);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_0046e743;
LAB_0046e785:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[31m",5);
  }
  if (_stderr == (FILE *)0x0) {
LAB_0046e7b6:
    lVar2 = *(long *)(std::cerr + -0x18);
    if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar2)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar2);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)lVar2 + 0x5deff8,SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_0046e7f8;
  }
  else {
    iVar1 = fileno(_stderr);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_0046e7b6;
LAB_0046e7f8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1m",4);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(description->_M_dataplus)._M_p,
                      description->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (poVar3 == (ostream *)&std::cout) {
    puVar4 = (undefined8 *)&stdout;
LAB_0046e86a:
    if ((FILE *)*puVar4 == (FILE *)0x0) goto LAB_0046e883;
    iVar1 = fileno((FILE *)*puVar4);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_0046e883;
LAB_0046e8c2:
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
  }
  else {
    if (poVar3 == (ostream *)&std::cerr || poVar3 == (ostream *)&std::clog) goto LAB_0046e86a;
LAB_0046e883:
    if (termcolor::_internal::colorize_index <
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0xc0)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 200);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)),
                         SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_0046e8c2;
  }
  if (file_name->_M_string_length == 0) goto LAB_0046ea4f;
  puVar4 = (undefined8 *)&stderr;
  if (_stderr == (FILE *)0x0) {
LAB_0046e901:
    lVar2 = *(long *)(std::cerr + -0x18);
    if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar2)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar2);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)lVar2 + 0x5deff8,SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_0046e93d;
  }
  else {
    iVar1 = fileno(_stderr);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_0046e901;
LAB_0046e93d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1m",4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(file_name->_M_dataplus)._M_p,
                      file_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")!",2);
  if (poVar3 == (ostream *)&std::cout) {
    puVar4 = (undefined8 *)&stdout;
LAB_0046e9e5:
    if ((FILE *)*puVar4 == (FILE *)0x0) goto LAB_0046e9fe;
    iVar1 = fileno((FILE *)*puVar4);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_0046e9fe;
  }
  else {
    if (poVar3 == (ostream *)&std::cerr || poVar3 == (ostream *)&std::clog) goto LAB_0046e9e5;
LAB_0046e9fe:
    if (termcolor::_internal::colorize_index <
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0xc0)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 200);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)),
                         SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) == 0) goto LAB_0046ea4f;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
LAB_0046ea4f:
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

void SQLLogicTestLogger::PrintErrorHeader(const string &file_name, idx_t query_line, const string &description) {
	PrintLineSep();
	std::cerr << termcolor::red << termcolor::bold << description << " " << termcolor::reset;
	if (!file_name.empty()) {
		std::cerr << termcolor::bold << "(" << file_name << ":" << query_line << ")!" << termcolor::reset;
	}
	std::cerr << std::endl;
}